

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

QByteArray * __thiscall EnumDef::qualifiedType(EnumDef *this,ClassDef *cdef)

{
  long lVar1;
  QByteArrayView bv;
  bool bVar2;
  QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *a;
  long in_RDX;
  storage_type *in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_const_char_(&)[3]>,_const_QByteArray_&>
  *in_stack_ffffffffffffff58;
  QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *in_stack_ffffffffffffff60;
  QByteArrayView *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = ::operator==((QByteArray *)in_RDI,(QByteArray *)in_RDI);
  if (bVar2) {
    a = (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)(in_RDX + 0x18);
    QByteArrayView::QByteArrayView<3ul>(this_00,(char (*) [3])in_RDI);
    bv.m_data = in_RSI;
    bv.m_size = (qsizetype)this_00;
    bVar2 = QByteArray::contains((QByteArray *)in_stack_ffffffffffffff58,bv);
    if (bVar2) {
      ::operator%((QByteArray *)in_RDI,(char (*) [3])a);
      ::operator%(a,(QByteArray *)in_stack_ffffffffffffff58);
      ::QStringBuilder::operator_cast_to_QByteArray(in_stack_ffffffffffffff58);
    }
    else {
      QByteArray::QByteArray((QByteArray *)a,(QByteArray *)in_stack_ffffffffffffff58);
    }
  }
  else {
    ::operator%((QByteArray *)in_RDI,(char (*) [3])in_stack_ffffffffffffff60);
    ::operator%(in_stack_ffffffffffffff60,(QByteArray *)in_stack_ffffffffffffff58);
    ::QStringBuilder::operator_cast_to_QByteArray(in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray EnumDef::qualifiedType(const ClassDef *cdef) const
{
    if (name == cdef->classname) {
        // The name of the enclosing namespace is the same as the enum class name
        if (cdef->qualified.contains("::")) {
            // QTBUG-112996, fully qualify by using cdef->qualified to disambiguate enum
            // class name and enclosing namespace, e.g.:
            // namespace A { namespace B { Q_NAMESPACE; enum class B { }; Q_ENUM_NS(B) } }
            return cdef->qualified % "::" % name;
        } else {
            // Just "B"; otherwise the compiler complains about the type "B::B" inside
            // "B::staticMetaObject" in the generated code; e.g.:
            // namespace B { Q_NAMESPACE; enum class B { }; Q_ENUM_NS(B) }
            return name;
        }
    }
    return cdef->classname % "::" % name;
}